

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O1

void __thiscall JsonString_Simple_Test::~JsonString_Simple_Test(JsonString_Simple_Test *this)

{
  void *in_RAX;
  
  (this->super_JsonString).super_Test._vptr_Test = (_func_int **)&PTR__JsonString_001c25a8;
  mock_json_callbacks::~mock_json_callbacks
            (&(this->super_JsonString).callbacks_.super_mock_json_callbacks);
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, Simple) {
    EXPECT_CALL (callbacks_, string_value ("hello")).Times (1);

    json::parser<decltype (proxy_)> p = json::make_parser (proxy_);
    p.input (R"("hello")"s).eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{8U, 1U}));
}